

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O2

void __thiscall dlib::resizable_tensor::clear(resizable_tensor *this)

{
  set_size(this,0,0,0,0);
  te::storage_heap::clear(&(this->_annotation).storage);
  gpu_data::set_size(&this->data_instance,0);
  return;
}

Assistant:

void clear(
        )
        {
            set_size(0,0,0,0);
            _annotation.clear();
            // free underlying memory
            data_instance.set_size(0);
        }